

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  short *psVar1;
  ushort uVar2;
  short sVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  float fVar8;
  StbUndoRecord *pSVar9;
  ImGuiContext *pIVar10;
  float fVar11;
  bool bVar12;
  int temp;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ImWchar *pIVar17;
  unsigned_short *puVar18;
  int *piVar19;
  int temp_1;
  long lVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  float *pfVar25;
  ImFont *in_R8;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  bool bVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  ImWchar ch;
  float local_50 [3];
  uint local_44;
  uint local_40;
  uint local_3c;
  ImWchar *local_38;
  
  state = &this->Stb;
LAB_00148270:
  switch(key) {
  case 0x200000:
    iVar16 = (this->Stb).select_start;
    iVar29 = (this->Stb).select_end;
    if (iVar16 == iVar29) {
      if (0 < state->cursor) {
        state->cursor = state->cursor + -1;
      }
    }
    else {
      if (iVar29 < iVar16) {
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar29;
      }
      iVar16 = (this->Stb).select_start;
      (this->Stb).cursor = iVar16;
      (this->Stb).select_end = iVar16;
      (this->Stb).has_preferred_x = '\0';
    }
    goto LAB_00148d5e;
  case 0x200001:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      state->cursor = state->cursor + 1;
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
    }
    ImStb::stb_textedit_clamp(this,state);
    goto LAB_00148d5e;
  case 0x200002:
  case 0x20000e:
switchD_0014828a_caseD_200002:
    iVar16 = 1;
    bVar12 = (key & 0xffbfffffU) == 0x20000e;
    if (bVar12) {
      iVar16 = (this->Stb).row_count_per_page;
    }
    bVar31 = (this->Stb).single_line == '\0';
    if (bVar12 || bVar31) {
      iVar29 = (this->Stb).select_start;
      iVar21 = (this->Stb).select_end;
      if ((key & 0x400000U) == 0) {
        if (iVar29 != iVar21) {
          if (iVar21 < iVar29) {
            (this->Stb).select_end = iVar29;
            (this->Stb).select_start = iVar21;
          }
          iVar29 = (this->Stb).select_start;
          (this->Stb).cursor = iVar29;
          (this->Stb).select_end = iVar29;
          (this->Stb).has_preferred_x = '\0';
        }
      }
      else if (iVar29 == iVar21) {
        iVar29 = (this->Stb).cursor;
        (this->Stb).select_end = iVar29;
        (this->Stb).select_start = iVar29;
      }
      else {
        state->cursor = iVar21;
      }
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_find_charpos
                ((ImStb *)local_50,(StbFindState *)this,
                 (ImGuiInputTextState *)(ulong)(uint)(this->Stb).cursor,
                 (uint)(this->Stb).single_line,(int)in_R8);
      fVar11 = local_50[0];
      uVar13 = local_44;
      uVar28 = local_3c;
      if (0 < iVar16) {
        iVar29 = 0;
        uVar27 = local_3c;
        do {
          uVar28 = uVar27;
          fVar32 = fVar11;
          if ((this->Stb).has_preferred_x != '\0') {
            fVar32 = (this->Stb).preferred_x;
          }
          if (uVar28 == uVar13) break;
          (this->Stb).cursor = uVar28;
          puVar18 = (this->TextW).Data;
          local_38 = (ImWchar *)0x0;
          pIVar17 = puVar18 + (int)uVar28;
          InputTextCalcTextSizeW
                    (pIVar17,puVar18 + this->CurLenW,&local_38,(ImVec2 *)0x1,SUB81(in_R8,0));
          pIVar10 = GImGui;
          uVar13 = (uint)((ulong)((long)local_38 - (long)pIVar17) >> 1);
          if (0 < (int)uVar13) {
            puVar18 = (this->TextW).Data;
            iVar21 = (this->Stb).cursor;
            fVar33 = 0.0;
            uVar26 = 1;
            do {
              uVar2 = puVar18[(long)(int)uVar28 + (uVar26 - 1)];
              fVar8 = -1.0;
              if (uVar2 != 10) {
                in_R8 = pIVar10->Font;
                pfVar25 = &in_R8->FallbackAdvanceX;
                if ((int)(uint)uVar2 < (in_R8->IndexAdvanceX).Size) {
                  pfVar25 = (float *)((ulong)((uint)uVar2 * 4) + (long)(in_R8->IndexAdvanceX).Data);
                }
                fVar8 = (pIVar10->FontSize / in_R8->FontSize) * *pfVar25;
              }
              if (((fVar8 == -1.0) && (!NAN(fVar8))) || (fVar33 = fVar33 + fVar8, fVar32 < fVar33))
              {
                bVar30 = false;
              }
              else {
                iVar21 = iVar21 + 1;
                state->cursor = iVar21;
                bVar30 = true;
              }
            } while ((bVar30) &&
                    (bVar30 = uVar26 < (uVar13 & 0x7fffffff), uVar26 = uVar26 + 1, bVar30));
          }
          ImStb::stb_textedit_clamp(this,state);
          (this->Stb).has_preferred_x = '\x01';
          (this->Stb).preferred_x = fVar32;
          if ((key & 0x400000U) != 0) {
            (this->Stb).select_end = (this->Stb).cursor;
          }
          uVar13 = uVar28 - 1;
          if ((int)uVar28 < 1) {
            uVar13 = 0;
          }
          lVar22 = (long)(int)uVar13;
          uVar14 = uVar13 + 1;
          do {
            uVar27 = (int)uVar13 >> 0x1f & uVar13;
            if (lVar22 < 1) break;
            uVar27 = uVar14 - 1;
            lVar20 = lVar22 + -1;
            lVar22 = lVar22 + -1;
            uVar14 = uVar27;
          } while ((this->TextW).Data[lVar20] != 10);
          iVar29 = iVar29 + 1;
          uVar13 = uVar28;
          uVar28 = uVar27;
        } while (iVar29 != iVar16);
      }
    }
    else {
      key = key & 0x400000U | 0x200000;
      uVar13 = local_44;
      uVar28 = local_3c;
    }
    local_3c = uVar28;
    local_44 = uVar13;
    if (bVar12 || bVar31) goto LAB_00148d62;
    goto LAB_00148270;
  case 0x200003:
  case 0x20000f:
    goto switchD_0014828a_caseD_200003;
  case 0x200004:
    ImStb::stb_textedit_clamp(this,state);
    iVar16 = (this->Stb).select_start;
    iVar29 = (this->Stb).select_end;
    if (iVar16 != iVar29) {
      if (iVar29 < iVar16) {
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar29;
      }
      iVar16 = (this->Stb).select_start;
      (this->Stb).cursor = iVar16;
      (this->Stb).select_end = iVar16;
      (this->Stb).has_preferred_x = '\0';
    }
    if ((this->Stb).single_line != '\0') {
      state->cursor = 0;
      goto LAB_00148d5e;
    }
    if ((long)state->cursor < 1) goto LAB_00148d5e;
    puVar18 = (this->TextW).Data;
    lVar22 = (long)state->cursor;
    goto LAB_00148dc1;
  case 0x200005:
    iVar16 = this->CurLenW;
    ImStb::stb_textedit_clamp(this,state);
    iVar29 = (this->Stb).select_start;
    iVar21 = (this->Stb).select_end;
    if (iVar29 != iVar21) {
      if (iVar21 < iVar29) {
        (this->Stb).select_end = iVar29;
        (this->Stb).select_start = iVar21;
      }
      iVar29 = (this->Stb).select_start;
      (this->Stb).cursor = iVar29;
      (this->Stb).select_end = iVar29;
      (this->Stb).has_preferred_x = '\0';
    }
    if ((this->Stb).single_line != '\0') {
      state->cursor = iVar16;
      goto LAB_00148d5e;
    }
    iVar29 = state->cursor;
    if (iVar16 <= iVar29) goto LAB_00148d5e;
    puVar18 = (this->TextW).Data + iVar29;
    goto LAB_00148d98;
  case 0x200006:
    (this->Stb).select_end = 0;
    (this->Stb).cursor = 0;
    (this->Stb).select_start = 0;
    goto LAB_00148d5e;
  case 0x200007:
    (this->Stb).cursor = this->CurLenW;
    (this->Stb).select_start = 0;
    (this->Stb).select_end = 0;
    goto LAB_00148d5e;
  case 0x200008:
switchD_0014828a_caseD_200008:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar16 = (this->Stb).cursor;
      if (iVar16 < this->CurLenW) {
        ImStb::stb_textedit_delete(this,state,iVar16,1);
      }
      goto LAB_00148d5e;
    }
    break;
  case 0x200009:
switchD_0014828a_caseD_200009:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      ImStb::stb_textedit_clamp(this,state);
      iVar16 = (this->Stb).cursor;
      if (0 < iVar16) {
        ImStb::stb_textedit_delete(this,state,iVar16 + -1,1);
        (this->Stb).cursor = (this->Stb).cursor + -1;
      }
      goto LAB_00148d5e;
    }
    break;
  case 0x20000a:
    lVar22 = (long)(this->Stb).undostate.undo_point;
    if (lVar22 == 0) goto LAB_00148d5e;
    iVar16 = (this->Stb).undostate.undo_rec[lVar22 + -1].where;
    iVar29 = (this->Stb).undostate.undo_rec[lVar22 + -1].insert_length;
    uVar13 = (this->Stb).undostate.undo_rec[lVar22 + -1].delete_length;
    uVar2 = (this->Stb).undostate.redo_point;
    uVar26 = (ulong)(short)uVar2;
    iVar21 = (this->Stb).undostate.undo_rec[lVar22 + -1].char_storage;
    (this->Stb).undostate.undo_rec[uVar26 - 1].char_storage = -1;
    (this->Stb).undostate.undo_rec[uVar26 - 1].insert_length = uVar13;
    (this->Stb).undostate.undo_rec[uVar26 - 1].delete_length = iVar29;
    (this->Stb).undostate.undo_rec[uVar26 - 1].where = iVar16;
    if ((ulong)uVar13 == 0) goto LAB_00149043;
    iVar23 = (this->Stb).undostate.undo_char_point + uVar13;
    if (iVar23 < 999) {
      iVar15 = (this->Stb).undostate.redo_char_point;
      bVar12 = iVar15 < iVar23;
      if (iVar15 < iVar23) goto joined_r0x00148e5b;
      goto LAB_00148fd4;
    }
    (this->Stb).undostate.undo_rec[uVar26 - 1].insert_length = 0;
    goto LAB_00149030;
  case 0x20000b:
    lVar22 = (long)(this->Stb).undostate.redo_point;
    if (lVar22 != 99) {
      sVar3 = (this->Stb).undostate.undo_point;
      iVar16 = (this->Stb).undostate.undo_rec[lVar22].where;
      iVar29 = (this->Stb).undostate.undo_rec[lVar22].insert_length;
      uVar13 = (this->Stb).undostate.undo_rec[lVar22].delete_length;
      iVar21 = (this->Stb).undostate.undo_rec[lVar22].char_storage;
      (this->Stb).undostate.undo_rec[sVar3].delete_length = iVar29;
      (this->Stb).undostate.undo_rec[sVar3].insert_length = uVar13;
      (this->Stb).undostate.undo_rec[sVar3].where = iVar16;
      (this->Stb).undostate.undo_rec[sVar3].char_storage = -1;
      if ((ulong)uVar13 != 0) {
        iVar23 = (this->Stb).undostate.undo_char_point;
        if ((this->Stb).undostate.redo_char_point < (int)(iVar23 + uVar13)) {
          pSVar9 = (this->Stb).undostate.undo_rec + sVar3;
          pSVar9->insert_length = 0;
          pSVar9->delete_length = 0;
        }
        else {
          (this->Stb).undostate.undo_rec[sVar3].char_storage = iVar23;
          (this->Stb).undostate.undo_char_point = iVar23 + uVar13;
          if (0 < (int)uVar13) {
            puVar18 = (this->TextW).Data;
            uVar26 = 0;
            do {
              (this->Stb).undostate.undo_char[(long)iVar23 + uVar26] =
                   puVar18[(long)iVar16 + uVar26];
              uVar26 = uVar26 + 1;
            } while (uVar13 != uVar26);
          }
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar16,uVar13);
      }
      if (iVar29 != 0) {
        ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar16,(this->Stb).undostate.undo_char + iVar21,iVar29)
        ;
        piVar19 = &(this->Stb).undostate.redo_char_point;
        *piVar19 = *piVar19 + iVar29;
      }
      (this->Stb).cursor = iVar29 + iVar16;
      uVar4 = (this->Stb).undostate.undo_point;
      uVar6 = (this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_point = uVar4 + 1;
      (this->Stb).undostate.redo_point = uVar6 + 1;
    }
    goto LAB_00148d5e;
  case 0x20000c:
    iVar16 = (this->Stb).select_start;
    iVar29 = (this->Stb).select_end;
    if (iVar16 == iVar29) {
      uVar13 = state->cursor;
      uVar28 = (int)uVar13 >> 0x1f & uVar13;
      goto LAB_00148ad2;
    }
    if (iVar29 < iVar16) {
      (this->Stb).select_end = iVar16;
      (this->Stb).select_start = iVar29;
    }
    iVar16 = (this->Stb).select_start;
    (this->Stb).cursor = iVar16;
    goto LAB_00148d5b;
  case 0x20000d:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar16 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
      (this->Stb).cursor = iVar16;
      goto LAB_00148df9;
    }
    ImStb::stb_textedit_move_to_last(this,state);
    goto LAB_00148d62;
  default:
    switch(key) {
    case 0x600000:
      ImStb::stb_textedit_clamp(this,state);
      iVar16 = (this->Stb).select_end;
      if ((this->Stb).select_start == iVar16) {
        iVar16 = (this->Stb).cursor;
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar16;
      }
      else {
        state->cursor = iVar16;
      }
      iVar16 = (this->Stb).select_end;
      if (0 < iVar16) {
        (this->Stb).select_end = iVar16 + -1;
      }
      break;
    case 0x600001:
      iVar16 = (this->Stb).select_end;
      if ((this->Stb).select_start == iVar16) {
        iVar16 = (this->Stb).cursor;
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar16;
      }
      else {
        state->cursor = iVar16;
      }
      piVar19 = &(this->Stb).select_end;
      *piVar19 = *piVar19 + 1;
      ImStb::stb_textedit_clamp(this,state);
      break;
    case 0x600002:
    case 0x60000e:
      goto switchD_0014828a_caseD_200002;
    case 0x600003:
    case 0x60000f:
      goto switchD_0014828a_caseD_200003;
    case 0x600004:
      ImStb::stb_textedit_clamp(this,state);
      iVar16 = (this->Stb).select_end;
      if ((this->Stb).select_start == iVar16) {
        iVar16 = (this->Stb).cursor;
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar16;
      }
      else {
        state->cursor = iVar16;
      }
      if ((this->Stb).single_line != '\0') {
        state->cursor = 0;
        goto LAB_00148d58;
      }
      if ((long)state->cursor < 1) goto LAB_00148d58;
      puVar18 = (this->TextW).Data;
      lVar22 = (long)state->cursor;
      goto LAB_00148d3a;
    case 0x600005:
      iVar16 = this->CurLenW;
      ImStb::stb_textedit_clamp(this,state);
      iVar29 = (this->Stb).select_end;
      if ((this->Stb).select_start == iVar29) {
        iVar29 = (this->Stb).cursor;
        (this->Stb).select_end = iVar29;
        (this->Stb).select_start = iVar29;
      }
      else {
        state->cursor = iVar29;
      }
      if ((this->Stb).single_line != '\0') {
        state->cursor = iVar16;
        goto LAB_00148d58;
      }
      iVar29 = state->cursor;
      if (iVar16 <= iVar29) goto LAB_00148d58;
      puVar18 = (this->TextW).Data + iVar29;
      goto LAB_00148d11;
    case 0x600006:
      iVar16 = (this->Stb).select_end;
      if ((this->Stb).select_start == iVar16) {
        iVar16 = (this->Stb).cursor;
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar16;
      }
      else {
        state->cursor = iVar16;
      }
      iVar16 = 0;
      goto LAB_00148c9e;
    case 0x600007:
      iVar16 = (this->Stb).select_end;
      if ((this->Stb).select_start == iVar16) {
        iVar16 = (this->Stb).cursor;
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar16;
      }
      else {
        state->cursor = iVar16;
      }
      iVar16 = this->CurLenW;
LAB_00148c9e:
      (this->Stb).select_end = iVar16;
      goto LAB_00148ca1;
    case 0x600008:
      goto switchD_0014828a_caseD_200008;
    case 0x600009:
      goto switchD_0014828a_caseD_200009;
    default:
      uVar13 = 0;
      if (key < 0x200000) {
        uVar13 = key;
      }
      if ((int)uVar13 < 1) goto LAB_00148d62;
      local_50[0] = (float)CONCAT22(local_50[0]._2_2_,(short)uVar13);
      if ((uVar13 == 10) && ((this->Stb).single_line != '\0')) goto LAB_00148d62;
      if (((this->Stb).insert_mode == '\0') || ((this->Stb).select_start != (this->Stb).select_end))
      {
LAB_00148e03:
        ImStb::stb_textedit_delete_selection(this,state);
        bVar12 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,(ImWchar *)local_50,1);
        if (!bVar12) goto LAB_00148d62;
        ImStb::stb_text_createundo(&(this->Stb).undostate,(this->Stb).cursor,0,1);
      }
      else {
        iVar16 = (this->Stb).cursor;
        if (this->CurLenW <= iVar16) goto LAB_00148e03;
        pIVar17 = ImStb::stb_text_createundo(&(this->Stb).undostate,iVar16,1,1);
        if (pIVar17 != (ImWchar *)0x0) {
          *pIVar17 = (this->TextW).Data[iVar16];
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,(this->Stb).cursor,1);
        bVar12 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,(ImWchar *)local_50,1);
        if (!bVar12) goto LAB_00148d62;
      }
      (this->Stb).cursor = (this->Stb).cursor + 1;
      goto LAB_00148d5e;
    case 0x60000c:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        iVar16 = (this->Stb).cursor;
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar16;
      }
      uVar13 = state->cursor;
      uVar28 = (int)uVar13 >> 0x1f & uVar13;
      goto LAB_001488d5;
    case 0x60000d:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        iVar16 = (this->Stb).cursor;
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar16;
      }
      iVar16 = this->CurLenW;
      iVar29 = (this->Stb).cursor;
      iVar21 = iVar29 + 1;
      if (iVar29 + 1 < iVar16) {
        iVar21 = iVar16;
      }
      goto LAB_00148830;
    }
    iVar16 = (this->Stb).select_end;
LAB_00148ca1:
    (this->Stb).cursor = iVar16;
    goto LAB_00148d5e;
  }
  ImStb::stb_textedit_delete_selection(this,state);
  goto LAB_00148d5e;
  while (iVar15 = ImStb::is_word_boundary_from_right(this,iVar29), iVar23 = iVar29, iVar15 == 0) {
LAB_00148830:
    iVar29 = iVar29 + 1;
    iVar23 = iVar21;
    if (iVar16 <= iVar29) break;
  }
  if (iVar23 < iVar16) {
    iVar16 = iVar23;
  }
  (this->Stb).cursor = iVar16;
  (this->Stb).select_end = iVar16;
  goto LAB_00148df9;
  while( true ) {
    uVar13 = uVar13 - 1;
    iVar16 = ImStb::is_word_boundary_from_right(this,uVar13);
    uVar27 = uVar13;
    if (iVar16 != 0) break;
LAB_001488d5:
    uVar27 = uVar28 - 1;
    if ((int)uVar13 < 1) break;
  }
  uVar13 = 0;
  if (0 < (int)uVar27) {
    uVar13 = uVar27;
  }
  (this->Stb).cursor = uVar13;
  (this->Stb).select_end = uVar13;
  goto LAB_00148df9;
  while( true ) {
    state->cursor = iVar29;
    puVar18 = puVar18 + 1;
    if (iVar29 == iVar16) break;
LAB_00148d11:
    iVar29 = iVar29 + 1;
    if (*puVar18 == 10) break;
  }
  goto LAB_00148d58;
  while( true ) {
    state->cursor = (int)lVar22 + -1;
    bVar12 = lVar22 < 2;
    lVar22 = lVar22 + -1;
    if (bVar12) break;
LAB_00148d3a:
    if (puVar18[lVar22 + -1] == 10) break;
  }
LAB_00148d58:
  iVar16 = (this->Stb).cursor;
LAB_00148d5b:
  (this->Stb).select_end = iVar16;
  goto LAB_00148d5e;
  while( true ) {
    uVar13 = uVar13 - 1;
    iVar16 = ImStb::is_word_boundary_from_right(this,uVar13);
    uVar27 = uVar13;
    if (iVar16 != 0) break;
LAB_00148ad2:
    uVar27 = uVar28 - 1;
    if ((int)uVar13 < 1) break;
  }
  uVar13 = 0;
  if (0 < (int)uVar27) {
    uVar13 = uVar27;
  }
  (this->Stb).cursor = uVar13;
LAB_00148df9:
  ImStb::stb_textedit_clamp(this,state);
  goto LAB_00148d62;
joined_r0x00148e5b:
  if (uVar2 == 99) goto LAB_00148d5e;
  if ((short)uVar26 < 99) {
    if (-1 < (this->Stb).undostate.undo_rec[0x62].char_storage) {
      iVar23 = (this->Stb).undostate.undo_rec[0x62].insert_length;
      lVar22 = (long)(this->Stb).undostate.redo_char_point + (long)iVar23;
      iVar15 = (int)lVar22;
      (this->Stb).undostate.redo_char_point = iVar15;
      pIVar17 = (this->Stb).undostate.undo_char + lVar22;
      memmove(pIVar17,pIVar17 + -(long)iVar23,(long)(999 - iVar15) * 2);
      lVar22 = (long)(this->Stb).undostate.redo_point;
      if (lVar22 < 0x62) {
        lVar20 = lVar22 + -0x62;
        piVar19 = &(this->Stb).undostate.undo_rec[lVar22].char_storage;
        do {
          if (-1 < *piVar19) {
            *piVar19 = *piVar19 + iVar23;
          }
          piVar19 = piVar19 + 4;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0);
      }
    }
    lVar22 = (long)(this->Stb).undostate.redo_point;
    memmove((this->Stb).undostate.undo_rec + lVar22 + 1,(this->Stb).undostate.undo_rec + lVar22,
            lVar22 * -0x10 + 0x620);
    psVar1 = &(this->Stb).undostate.redo_point;
    *psVar1 = *psVar1 + 1;
  }
  iVar23 = (this->Stb).undostate.undo_char_point + uVar13;
  iVar15 = (this->Stb).undostate.redo_char_point;
  bVar12 = iVar15 < iVar23;
  if (iVar23 <= iVar15) goto LAB_00148fd4;
  uVar2 = (this->Stb).undostate.redo_point;
  uVar26 = (ulong)uVar2;
  goto joined_r0x00148e5b;
LAB_00148fd4:
  (this->Stb).undostate.undo_rec[(long)(this->Stb).undostate.redo_point + -1].char_storage =
       iVar15 - uVar13;
  (this->Stb).undostate.redo_char_point = iVar15 - uVar13;
  if (0 < (int)uVar13) {
    puVar18 = (this->TextW).Data;
    uVar26 = 0;
    do {
      *(unsigned_short *)
       ((long)this + uVar26 * 2 + (long)iVar15 * 2 + (long)(int)uVar13 * -2 + 0x69c) =
           puVar18[(long)iVar16 + uVar26];
      uVar26 = uVar26 + 1;
    } while (uVar13 != uVar26);
  }
  if (!bVar12) {
LAB_00149030:
    ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar16,uVar13);
LAB_00149043:
    if (iVar29 != 0) {
      ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar16,(this->Stb).undostate.undo_char + iVar21,iVar29);
      piVar19 = &(this->Stb).undostate.undo_char_point;
      *piVar19 = *piVar19 - iVar29;
    }
    (this->Stb).cursor = iVar29 + iVar16;
    uVar5 = (this->Stb).undostate.undo_point;
    uVar7 = (this->Stb).undostate.redo_point;
    (this->Stb).undostate.undo_point = uVar5 + -1;
    (this->Stb).undostate.redo_point = uVar7 + -1;
  }
  goto LAB_00148d5e;
  while( true ) {
    state->cursor = iVar29;
    puVar18 = puVar18 + 1;
    if (iVar29 == iVar16) break;
LAB_00148d98:
    iVar29 = iVar29 + 1;
    if (*puVar18 == 10) break;
  }
  goto LAB_00148d5e;
switchD_0014828a_caseD_200003:
  iVar16 = 1;
  bVar12 = (key & 0xffbfffffU) == 0x20000f;
  if (bVar12) {
    iVar16 = (this->Stb).row_count_per_page;
  }
  bVar31 = (this->Stb).single_line == '\0';
  if (bVar12 || bVar31) {
    iVar29 = (this->Stb).select_start;
    iVar21 = (this->Stb).select_end;
    if ((key & 0x400000U) == 0) {
      if (iVar29 != iVar21) {
        ImStb::stb_textedit_move_to_last(this,state);
      }
    }
    else if (iVar29 == iVar21) {
      iVar29 = (this->Stb).cursor;
      (this->Stb).select_end = iVar29;
      (this->Stb).select_start = iVar29;
    }
    else {
      state->cursor = iVar21;
    }
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_find_charpos
              ((ImStb *)local_50,(StbFindState *)this,
               (ImGuiInputTextState *)(ulong)(uint)(this->Stb).cursor,(uint)(this->Stb).single_line,
               (int)in_R8);
    fVar11 = local_50[0];
    uVar13 = local_44;
    uVar28 = local_40;
    if (0 < iVar16) {
      uVar26 = (ulong)local_40;
      iVar29 = 0;
      do {
        uVar28 = (uint)uVar26;
        fVar32 = fVar11;
        if ((this->Stb).has_preferred_x != '\0') {
          fVar32 = (this->Stb).preferred_x;
        }
        if (uVar28 == 0) break;
        uVar27 = uVar13 + uVar28;
        puVar18 = (this->TextW).Data;
        if (puVar18[(long)(int)uVar27 + -1] != 10) break;
        (this->Stb).cursor = uVar27;
        local_38 = (ImWchar *)0x0;
        InputTextCalcTextSizeW
                  (puVar18 + (int)uVar27,puVar18 + this->CurLenW,&local_38,(ImVec2 *)0x1,
                   SUB81(in_R8,0));
        pIVar10 = GImGui;
        uVar26 = (ulong)((long)local_38 - (long)(puVar18 + (int)uVar27)) >> 1;
        uVar28 = (uint)uVar26;
        if (0 < (int)uVar28) {
          puVar18 = (this->TextW).Data;
          iVar21 = (this->Stb).cursor;
          fVar33 = 0.0;
          uVar24 = 1;
          do {
            uVar2 = puVar18[(long)(int)uVar27 + (uVar24 - 1)];
            fVar8 = -1.0;
            if (uVar2 != 10) {
              in_R8 = pIVar10->Font;
              pfVar25 = &in_R8->FallbackAdvanceX;
              if ((int)(uint)uVar2 < (in_R8->IndexAdvanceX).Size) {
                pfVar25 = (float *)((ulong)((uint)uVar2 * 4) + (long)(in_R8->IndexAdvanceX).Data);
              }
              fVar8 = (pIVar10->FontSize / in_R8->FontSize) * *pfVar25;
            }
            if (((fVar8 == -1.0) && (!NAN(fVar8))) || (fVar33 = fVar33 + fVar8, fVar32 < fVar33)) {
              bVar30 = false;
            }
            else {
              iVar21 = iVar21 + 1;
              state->cursor = iVar21;
              bVar30 = true;
            }
          } while ((bVar30) &&
                  (bVar30 = uVar24 < (uVar28 & 0x7fffffff), uVar24 = uVar24 + 1, bVar30));
        }
        ImStb::stb_textedit_clamp(this,state);
        (this->Stb).has_preferred_x = '\x01';
        (this->Stb).preferred_x = fVar32;
        if ((key & 0x400000U) != 0) {
          (this->Stb).select_end = (this->Stb).cursor;
        }
        iVar29 = iVar29 + 1;
        uVar13 = uVar27;
      } while (iVar29 != iVar16);
    }
  }
  else {
    key = key & 0x400000U | 0x200001;
    uVar13 = local_44;
    uVar28 = local_40;
  }
  local_40 = uVar28;
  local_44 = uVar13;
  if (bVar12 || bVar31) goto LAB_00148d62;
  goto LAB_00148270;
  while( true ) {
    state->cursor = (int)lVar22 + -1;
    bVar12 = lVar22 < 2;
    lVar22 = lVar22 + -1;
    if (bVar12) break;
LAB_00148dc1:
    if (puVar18[lVar22 + -1] == 10) break;
  }
LAB_00148d5e:
  (this->Stb).has_preferred_x = '\0';
LAB_00148d62:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}